

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_threads.cc
# Opt level: O0

void __thiscall AllReduceSync::~AllReduceSync(AllReduceSync *this)

{
  condition_variable *this_00;
  undefined8 *in_RDI;
  
  if ((void *)*in_RDI != (void *)0x0) {
    operator_delete((void *)*in_RDI);
  }
  this_00 = (condition_variable *)in_RDI[1];
  if (this_00 != (condition_variable *)0x0) {
    std::condition_variable::~condition_variable(this_00);
    operator_delete(this_00);
  }
  if ((void *)in_RDI[4] != (void *)0x0) {
    operator_delete__((void *)in_RDI[4]);
  }
  return;
}

Assistant:

AllReduceSync::~AllReduceSync()
{
  delete m_mutex;
  delete m_cv;
  delete[] buffers;
}